

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O0

void print_event_count_proc(Am_Object *interp)

{
  int iVar1;
  Am_Value *value;
  long lVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Time local_60 [8];
  long local_58;
  long ms;
  Am_Time stop;
  int n;
  Am_Object local_28;
  Am_Object_Method local_20;
  Am_Object *local_10;
  Am_Object *interp_local;
  
  local_10 = interp;
  Am_Object::Get_Prototype();
  value = (Am_Value *)Am_Object::Get((ushort)&local_28,0xca);
  Am_Object_Method::Am_Object_Method(&local_20,value);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc0,(Am_Object *)interp);
  (*local_20.Call)((Am_Object_Data *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object(&local_28);
  iVar1 = (int)event_count;
  Am_Time::Now();
  Am_Time::operator-(local_60,(Am_Time *)&ms);
  lVar2 = Am_Time::Milliseconds();
  Am_Time::~Am_Time(local_60);
  local_58 = lVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"Animation constraint executed ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," steps in ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_58);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"for average cost of ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)local_58 / (double)iVar1);
  poVar3 = std::operator<<(poVar3," ms per iteration.");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  Am_Exit_Main_Event_Loop();
  Am_Time::~Am_Time((Am_Time *)&ms);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, print_event_count, (Am_Object interp))
{
  Am_Object_Method(interp.Get_Prototype().Get(Am_DO_METHOD)).Call(interp);

  int n = event_count;
  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Animation constraint executed " << n << " steps in " << ms
            << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  Am_Exit_Main_Event_Loop();
}